

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeDecodersController::TransformAttributesToOriginalFormat
          (SequentialAttributeDecodersController *this)

{
  __uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  _Var1;
  PointAttribute *pPVar2;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  PointAttribute *pPVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  ulong uVar8;
  allocator<char> local_69;
  uint local_68;
  Type local_64;
  PointAttribute *local_60;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *local_58;
  string local_50;
  
  local_68 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
               _vptr_AttributesDecoderInterface[6])();
  local_58 = &this->point_ids_;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)local_68) {
    uVar8 = (ulong)local_68;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    iVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[7])(this);
    if (*(long *)(CONCAT44(extraout_var,iVar5) + 0x50) == 0) {
LAB_0013f578:
      _Var1._M_t.
      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
      .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
           (this->sequential_decoders_).
           super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
           super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
           ._M_t;
      cVar4 = (**(code **)(*(long *)_Var1._M_t.
                                    super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                                    .
                                    super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>
                                    ._M_head_impl + 0x30))
                        (_Var1._M_t.
                         super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                         .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                         _M_head_impl,local_58);
      if (cVar4 == '\0') break;
    }
    else {
      _Var1._M_t.
      super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
      .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>._M_head_impl =
           (this->sequential_decoders_).
           super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
           super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
           ._M_t;
      pPVar2 = *(PointAttribute **)
                ((long)_Var1._M_t.
                       super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                       .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                       _M_head_impl + 0x10);
      pPVar6 = SequentialAttributeDecoder::GetPortableAttribute
                         ((SequentialAttributeDecoder *)
                          _Var1._M_t.
                          super__Tuple_impl<0UL,_draco::SequentialAttributeDecoder_*,_std::default_delete<draco::SequentialAttributeDecoder>_>
                          .super__Head_base<0UL,_draco::SequentialAttributeDecoder_*,_false>.
                          _M_head_impl);
      if (pPVar6 == (PointAttribute *)0x0) goto LAB_0013f578;
      local_60 = pPVar6;
      iVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[7])(this);
      this_00 = *(DracoOptions<draco::GeometryAttribute::Type> **)
                 (CONCAT44(extraout_var_00,iVar5) + 0x50);
      local_64 = (pPVar2->super_GeometryAttribute).attribute_type_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"skip_attribute_transform",&local_69);
      bVar3 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                        (this_00,&local_64,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar3) goto LAB_0013f578;
      PointAttribute::CopyFrom
                (*(PointAttribute **)
                  ((long)(this->sequential_decoders_).
                         super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                         super___uniq_ptr_impl<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                         ._M_t + 0x10),local_60);
    }
  }
  return (long)(int)local_68 <= (long)uVar7;
}

Assistant:

bool SequentialAttributeDecodersController::
    TransformAttributesToOriginalFormat() {
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    // Check whether the attribute transform should be skipped.
    if (GetDecoder()->options()) {
      const PointAttribute *const attribute =
          sequential_decoders_[i]->attribute();
      const PointAttribute *const portable_attribute =
          sequential_decoders_[i]->GetPortableAttribute();
      if (portable_attribute &&
          GetDecoder()->options()->GetAttributeBool(
              attribute->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        sequential_decoders_[i]->attribute()->CopyFrom(*portable_attribute);
        continue;
      }
    }
    if (!sequential_decoders_[i]->TransformAttributeToOriginalFormat(
            point_ids_)) {
      return false;
    }
  }
  return true;
}